

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O0

void Abc_SclSclGates2MioGates(SC_Lib *pLib,Abc_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pObj_00;
  SC_Cell *pSVar3;
  Mio_Gate_t *pMVar4;
  uint local_34;
  uint local_30;
  int CounterAll;
  int Counter;
  int i;
  SC_Cell *pCell;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *p_local;
  SC_Lib *pLib_local;
  
  local_30 = 0;
  local_34 = 0;
  if (p->vGates == (Vec_Int_t *)0x0) {
    __assert_fail("p->vGates != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                  ,0x4b,"void Abc_SclSclGates2MioGates(SC_Lib *, Abc_Ntk_t *)");
  }
  CounterAll = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= CounterAll) {
      if (local_30 != 0) {
        printf("Could not find %d (out of %d) gates in the current library.\n",(ulong)local_30,
               (ulong)local_34);
      }
      Vec_IntFreeP(&p->vGates);
      p->pSCLib = (void *)0x0;
      return;
    }
    pObj_00 = Abc_NtkObj(p,CounterAll);
    if ((((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) &&
        (iVar1 = Abc_ObjFaninNum(pObj_00), iVar1 != 0)) &&
       (iVar1 = Abc_ObjIsBarBuf(pObj_00), iVar1 == 0)) {
      pSVar3 = Abc_SclObjCell(pObj_00);
      iVar1 = pSVar3->n_inputs;
      iVar2 = Abc_ObjFaninNum(pObj_00);
      if (iVar1 != iVar2) {
        __assert_fail("pCell->n_inputs == Abc_ObjFaninNum(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                      ,0x4f,"void Abc_SclSclGates2MioGates(SC_Lib *, Abc_Ntk_t *)");
      }
      pMVar4 = Mio_LibraryReadGateByName((Mio_Library_t *)p->pManFunc,pSVar3->pName,(char *)0x0);
      (pObj_00->field_5).pData = pMVar4;
      local_30 = ((pObj_00->field_5).pData == (void *)0x0) + local_30;
      if (((*(uint *)&pObj_00->field_0x14 >> 4 & 1) != 0) ||
         ((*(uint *)&pObj_00->field_0x14 >> 5 & 1) != 0)) {
        __assert_fail("pObj->fMarkA == 0 && pObj->fMarkB == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUtil.c"
                      ,0x52,"void Abc_SclSclGates2MioGates(SC_Lib *, Abc_Ntk_t *)");
      }
      local_34 = local_34 + 1;
    }
    CounterAll = CounterAll + 1;
  } while( true );
}

Assistant:

void Abc_SclSclGates2MioGates( SC_Lib * pLib, Abc_Ntk_t * p )
{
    Abc_Obj_t * pObj;
    SC_Cell * pCell;
    int i, Counter = 0, CounterAll = 0;
    assert( p->vGates != NULL );
    Abc_NtkForEachNodeNotBarBuf1( p, pObj, i )
    {
        pCell = Abc_SclObjCell(pObj);
        assert( pCell->n_inputs == Abc_ObjFaninNum(pObj) );
        pObj->pData = Mio_LibraryReadGateByName( (Mio_Library_t *)p->pManFunc, pCell->pName, NULL );
        Counter += (pObj->pData == NULL);
        assert( pObj->fMarkA == 0 && pObj->fMarkB == 0 );
        CounterAll++;
    }
    if ( Counter )
        printf( "Could not find %d (out of %d) gates in the current library.\n", Counter, CounterAll );
    Vec_IntFreeP( &p->vGates );
    p->pSCLib = NULL;
}